

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.cpp
# Opt level: O3

void * NULLC::alignedAlloc(int size)

{
  long lVar1;
  void *pvVar2;
  
  lVar1 = (*(code *)alloc)(size + 0x17);
  if (lVar1 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(lVar1 + 0x17U & 0xfffffffffffffff0);
    *(long *)((long)pvVar2 - 8) = lVar1;
  }
  return pvVar2;
}

Assistant:

void* NULLC::alignedAlloc(int size)
{
	void *unaligned = alloc((size + 16 - 1) + sizeof(void*));
	if(!unaligned)
		return NULL;
	void *ptr = (void*)(((intptr_t)unaligned + sizeof(void*) + 16 - 1) & ~(16 - 1));
	memcpy((void**)ptr - 1, &unaligned, sizeof(unaligned));
	return ptr;
}